

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmELF.cxx
# Opt level: O2

bool __thiscall
cmELFInternalImpl<cmELFTypes64>::Read(cmELFInternalImpl<cmELFTypes64> *this,ELF_Ehdr *x)

{
  ushort uVar1;
  uint uVar2;
  ushort uVar3;
  byte bVar4;
  long *plVar5;
  ushort uVar6;
  
  plVar5 = (long *)std::istream::read((char *)(this->super_cmELFInternal).Stream,(long)x);
  uVar2 = *(uint *)((long)plVar5 + *(long *)(*plVar5 + -0x18) + 0x20);
  if ((uVar2 & 5) == 0) {
    uVar1 = x->e_type;
    uVar6 = uVar1 >> 8;
    bVar4 = (this->super_cmELFInternal).NeedSwap;
    uVar3 = uVar1;
    if ((bool)bVar4 == false) {
      uVar3 = uVar6;
      uVar6 = uVar1;
    }
    if ((((uVar3 & 0xff) != 0xfe) &&
        (uVar6 = uVar6 & 0xff, 0x104 < (ushort)(uVar3 * 0x100 + uVar6 + 0x100))) &&
       ((uVar6 == 0xfe || ((ushort)(uVar6 * 0x100 + (uVar3 & 0xff) + 0x100) < 0x105)))) {
      bVar4 = bVar4 ^ 1;
      (this->super_cmELFInternal).NeedSwap = (bool)bVar4;
    }
    if (bVar4 != 0) {
      ByteSwap(this,x);
    }
  }
  return (uVar2 & 5) == 0;
}

Assistant:

bool Read(ELF_Ehdr& x)
    {
    // Read the header from the file.
    if(!this->Stream.read(reinterpret_cast<char*>(&x), sizeof(x)))
      {
      return false;
      }

    // The byte order of ELF header fields may not match that of the
    // processor-specific data.  The header fields are ordered to
    // match the target execution environment, so we may need to
    // memorize the order of all platforms based on the e_machine
    // value.  As a heuristic, if the type is invalid but its
    // swapped value is okay then flip our swap mode.
    ELF_Half et = x.e_type;
    if(this->NeedSwap)
      {
      cmELFByteSwap(et);
      }
    if(!this->FileTypeValid(et))
      {
      cmELFByteSwap(et);
      if(this->FileTypeValid(et))
        {
        // The previous byte order guess was wrong.  Flip it.
        this->NeedSwap = !this->NeedSwap;
        }
      }

    // Fix the byte order of the header.
    if(this->NeedSwap)
      {
      ByteSwap(x);
      }
    return true;
    }